

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::CheckTargetsForPchCompilePdb(cmGlobalGenerator *this)

{
  undefined8 *puVar1;
  cmGeneratorTarget *pcVar2;
  size_t __n;
  cmake *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  cmValue cVar6;
  string *psVar7;
  string *psVar8;
  char *extraout_RDX;
  undefined8 *puVar9;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string e;
  string local_e0;
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  size_type local_98;
  undefined1 local_90 [16];
  _Rb_tree_impl<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  local_80;
  undefined8 local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  cmGlobalGenerator *local_38;
  
  local_c0._0_8_ = local_c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"C","");
  bVar3 = cmState::GetLanguageEnabled
                    ((this->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_c0);
  if (bVar3) {
    bVar3 = false;
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"CXX","");
    bVar3 = cmState::GetLanguageEnabled
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = !bVar3;
  }
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if (!bVar3) {
    local_40 = (_Base_ptr)
               (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (_Base_ptr)
               (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_40 != local_48) {
      bVar3 = false;
      local_38 = this;
      do {
        puVar1 = *(undefined8 **)
                  ((long)*(__uniq_ptr_data<cmLocalGenerator,_std::default_delete<cmLocalGenerator>,_true,_true>
                           *)local_40 + 0x150);
        for (puVar9 = *(undefined8 **)
                       ((long)*(__uniq_ptr_data<cmLocalGenerator,_std::default_delete<cmLocalGenerator>,_true,_true>
                                *)local_40 + 0x148); puVar9 != puVar1; puVar9 = puVar9 + 1) {
          bVar4 = cmGeneratorTarget::CanCompileSources((cmGeneratorTarget *)*puVar9);
          if (bVar4) {
            pcVar2 = (cmGeneratorTarget *)*puVar9;
            local_c0._0_8_ = local_c0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c0,"ghs_integrity_app","");
            cVar6 = cmGeneratorTarget::GetProperty(pcVar2,(string *)local_c0);
            if (cVar6.Value == (string *)0x0) {
              bVar4 = false;
            }
            else {
              value._M_str = extraout_RDX;
              value._M_len = (size_t)((cVar6.Value)->_M_dataplus)._M_p;
              bVar4 = cmValue::IsOn((cmValue *)(cVar6.Value)->_M_string_length,value);
            }
            if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
              operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
            }
            if (bVar4 == false) {
              pcVar2 = (cmGeneratorTarget *)*puVar9;
              local_c0._0_8_ = local_c0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c0,"PRECOMPILE_HEADERS_REUSE_FROM","");
              psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar2,(string *)local_c0);
              if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
                operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
              }
              pcVar2 = (cmGeneratorTarget *)*puVar9;
              local_c0._0_8_ = local_c0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c0,"COMPILE_PDB_NAME","");
              psVar8 = cmGeneratorTarget::GetSafeProperty(pcVar2,(string *)local_c0);
              if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
                operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
              }
              __n = psVar7->_M_string_length;
              if ((__n != 0) &&
                 ((__n != psVar8->_M_string_length ||
                  (iVar5 = bcmp((psVar7->_M_dataplus)._M_p,(psVar8->_M_dataplus)._M_p,__n),
                  iVar5 != 0)))) {
                psVar8 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)*puVar9);
                local_c0._0_8_ = (pointer)0x3a;
                local_c0._8_8_ = "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"";
                local_c0._16_8_ = 0;
                local_a0._M_p = (psVar8->_M_dataplus)._M_p;
                local_c0._24_8_ = psVar8->_M_string_length;
                local_98 = 0;
                local_90._0_8_ = 0x5a;
                local_90._8_8_ =
                     "\"). Reusable precompile headers requires the COMPILE_PDB_NAME property to have the value \""
                ;
                local_80._0_8_ = 0;
                local_80.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)(psVar7->_M_dataplus)._M_p;
                local_80.super__Rb_tree_header._M_header._0_8_ = psVar7->_M_string_length;
                local_80.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
                local_80.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x2;
                local_80.super__Rb_tree_header._M_node_count = 0x8cbb73;
                local_50 = 0;
                views._M_len = 5;
                views._M_array = (iterator)local_c0;
                cmCatViews(&local_e0,views);
                this_00 = local_38->CMakeInstance;
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_c0);
                cmake::IssueMessage(this_00,FATAL_ERROR,&local_e0,(cmListFileBacktrace *)local_c0);
                if ((cmMakefile *)local_c0._8_8_ != (cmMakefile *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                bVar3 = true;
              }
            }
          }
        }
        local_40 = (_Base_ptr)&local_40->_M_parent;
      } while (local_40 != local_48);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForPchCompilePdb() const
{
  if (!this->GetLanguageEnabled("C") && !this->GetLanguageEnabled("CXX")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      if (!target->CanCompileSources() ||
          target->GetProperty("ghs_integrity_app").IsOn()) {
        continue;
      }

      std::string const& reuseFrom =
        target->GetSafeProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      std::string const& compilePdb =
        target->GetSafeProperty("COMPILE_PDB_NAME");

      if (!reuseFrom.empty() && reuseFrom != compilePdb) {
        const std::string e = cmStrCat(
          "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"",
          target->GetName(),
          "\"). Reusable precompile headers requires the COMPILE_PDB_NAME"
          " property to have the value \"",
          reuseFrom, "\"\n");
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e,
                                               target->GetBacktrace());
        failed = true;
      }
    }
  }
  return failed;
}